

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

shared_ptr<const_libtorrent::torrent_info> __thiscall
libtorrent::aux::torrent::get_torrent_file(torrent *this)

{
  bool bVar1;
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RSI;
  shared_ptr<const_libtorrent::torrent_info> sVar3;
  torrent *this_local;
  
  this_00 = ::std::
            __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)(in_RSI + 0x18));
  bVar1 = torrent_info::is_valid(this_00);
  if (bVar1) {
    ::std::shared_ptr<libtorrent::torrent_info_const>::shared_ptr<libtorrent::torrent_info,void>
              ((shared_ptr<libtorrent::torrent_info_const> *)this,
               (shared_ptr<libtorrent::torrent_info> *)(in_RSI + 0x18));
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    ::std::shared_ptr<const_libtorrent::torrent_info>::shared_ptr
              ((shared_ptr<const_libtorrent::torrent_info> *)this);
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_libtorrent::torrent_info>)
         sVar3.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const torrent_info> torrent::get_torrent_file() const
	{
		if (!m_torrent_file->is_valid()) return {};
		return m_torrent_file;
	}